

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O2

void Abc_NtkSetMvVarValues(Abc_Obj_t *pObj,int nValues)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  int nCapMin;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  Vec_Att_t *p;
  void **ppvVar5;
  Mem_Flex_t *p_00;
  
  if (nValues < 2) {
    __assert_fail("nValues > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBlifMv.c"
                  ,0x5f,"void Abc_NtkSetMvVarValues(Abc_Obj_t *, int)");
  }
  if (nValues != 2) {
    pvVar3 = Abc_ObjMvVar(pObj);
    if (pvVar3 == (void *)0x0) {
      pNtk = pObj->pNtk;
      pvVar3 = Abc_NtkMvVar(pNtk);
      if (pvVar3 == (void *)0x0) {
        p_00 = (Mem_Flex_t *)0x0;
      }
      else {
        pvVar3 = Abc_NtkMvVar(pNtk);
        p_00 = *(Mem_Flex_t **)((long)pvVar3 + 0x10);
      }
      piVar4 = (int *)Mem_FlexEntryFetch(p_00,0x10);
      *piVar4 = nValues;
      piVar4[2] = 0;
      piVar4[3] = 0;
      p = (Vec_Att_t *)Abc_NtkMvVar(pObj->pNtk);
      ppvVar5 = p->pArrayPtr;
      if (ppvVar5 == (void **)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                      ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      if (p->pFuncStartObj != (_func_void_ptr_void_ptr *)0x0) {
        __assert_fail("p->pFuncStartObj == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                      ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      iVar1 = pObj->Id;
      if (p->nCap <= iVar1) {
        iVar2 = p->nCap * 2;
        nCapMin = iVar1 + 10;
        if (iVar1 < iVar2) {
          nCapMin = iVar2;
        }
        Vec_AttGrow(p,nCapMin);
        ppvVar5 = p->pArrayPtr;
      }
      ppvVar5[iVar1] = piVar4;
    }
  }
  return;
}

Assistant:

void Abc_NtkSetMvVarValues( Abc_Obj_t * pObj, int nValues )
{
    Mem_Flex_t * pFlex;
    struct temp 
    { 
        int nValues; 
        char ** pNames; 
    } * pVarStruct;
    assert( nValues > 1 );
    // skip binary signals
    if ( nValues == 2 )
        return;
    // skip already assigned signals
    if ( Abc_ObjMvVar(pObj) != NULL )
        return;
    // create the structure
    pFlex = (Mem_Flex_t *)Abc_NtkMvVarMan( pObj->pNtk );
    pVarStruct = (struct temp *)Mem_FlexEntryFetch( pFlex, sizeof(struct temp) );
    pVarStruct->nValues = nValues;
    pVarStruct->pNames = NULL;
    Abc_ObjSetMvVar( pObj, pVarStruct );
}